

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

ConfidentialTxOutReference * __thiscall
cfd::ConfidentialTransactionController::UpdateTxOutFeeAmount
          (ConfidentialTxOutReference *__return_storage_ptr__,
          ConfidentialTransactionController *this,uint32_t index,Amount *value,
          ConfidentialAssetId *asset)

{
  bool bVar1;
  CfdException *this_00;
  ConfidentialTransaction *this_01;
  Script local_1b8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_180;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_168;
  ConfidentialNonce local_150;
  ConfidentialTxOutReference ref;
  
  this_01 = &this->transaction_;
  core::ConfidentialTransaction::GetTxOut(&ref,this_01,index);
  core::Script::Script(&local_1b8,&ref.super_AbstractTxOutReference.locking_script_);
  bVar1 = core::Script::IsEmpty(&local_1b8);
  core::Script::~Script(&local_1b8);
  if (bVar1) {
    core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)&local_1b8,value);
    core::ConfidentialNonce::ConfidentialNonce(&local_150);
    core::ByteData::ByteData((ByteData *)&local_180);
    core::ByteData::ByteData((ByteData *)&local_168);
    core::ConfidentialTransaction::SetTxOutCommitment
              (this_01,index,asset,(ConfidentialValue *)&local_1b8,&local_150,(ByteData *)&local_180
               ,(ByteData *)&local_168);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_168);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_180);
    core::ConfidentialNonce::~ConfidentialNonce(&local_150);
    core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&local_1b8);
    core::ConfidentialTransaction::GetTxOut(__return_storage_ptr__,this_01,index);
    core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&ref);
    return __return_storage_ptr__;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_1b8,"target is not fee txout.",(allocator *)&local_150);
  core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&local_1b8);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

const ConfidentialTxOutReference
ConfidentialTransactionController::UpdateTxOutFeeAmount(
    uint32_t index, const Amount& value, const ConfidentialAssetId& asset) {
  ConfidentialTxOutReference ref = transaction_.GetTxOut(index);
  if (!ref.GetLockingScript().IsEmpty()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "target is not fee txout.");
  }
  transaction_.SetTxOutCommitment(
      index, asset, ConfidentialValue(value), ConfidentialNonce(), ByteData(),
      ByteData());
  return transaction_.GetTxOut(index);
}